

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blake3_portable.c
# Opt level: O3

void blake3_compress_in_place_portable
               (uint32_t *cv,uint8_t *block,uint8_t block_len,uint64_t counter,uint8_t flags)

{
  uint8_t uVar1;
  undefined2 uVar2;
  ushort uVar3;
  ushort uVar4;
  undefined1 auVar5 [16];
  uint3 uVar6;
  uint3 uVar7;
  uint uVar8;
  undefined3 in_register_00000011;
  uint uVar9;
  undefined3 in_register_00000081;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined4 uVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  
  auVar21 = _DAT_001a8270;
  auVar25 = _DAT_001a8260;
  uVar6 = *(uint3 *)(block + 0x18);
  uVar2 = *(undefined2 *)(block + 0x24);
  uVar3 = *(ushort *)(block + 0xc);
  uVar7 = *(uint3 *)block;
  auVar18 = vpmovsxbd_avx(ZEXT416(0x1000503));
  auVar26 = vpmovsxbd_avx(ZEXT416(0x1000600));
  uVar1 = block[0x26];
  uVar4 = *(ushort *)(block + 4);
  uVar9 = (uint)CONCAT12(block[0x3e],*(undefined2 *)(block + 0x3c));
  auVar13 = vpinsrb_avx(ZEXT116(block[0x27]),(uint)block[0x1b],1);
  auVar13 = vpinsrb_avx(auVar13,(uint)block[0x3f],2);
  auVar13 = vpinsrb_avx(auVar13,(uint)block[3],3);
  auVar22 = vpshufb_avx(auVar13,_DAT_001a8250);
  auVar13 = vpinsrw_avx(ZEXT216(*(ushort *)(block + 0x10)),(uint)*(ushort *)(block + 0x34),2);
  auVar19 = vpinsrw_avx(auVar13,(uint)*(ushort *)(block + 0x28),4);
  auVar13 = vpinsrb_avx(ZEXT116(block[0x12]),(uint)block[0x36],1);
  auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(block + 0x30),6);
  auVar13 = vpinsrb_avx(auVar13,(uint)block[0x2a],2);
  auVar13 = vpinsrb_avx(auVar13,(uint)block[0x32],3);
  auVar13 = vpshufb_avx(auVar13,_DAT_001a8260);
  auVar23 = vpor_avx(auVar13,auVar19);
  auVar13 = vpinsrb_avx(ZEXT116(block[0x13]),(uint)block[0x37],1);
  auVar13 = vpinsrb_avx(auVar13,(uint)block[0x2b],2);
  auVar13 = vpinsrb_avx(auVar13,(uint)block[0x33],3);
  uVar8 = vmread(uVar9);
  *(byte *)(ulong)uVar4 = *(byte *)(ulong)uVar4 | (byte)*(undefined2 *)(block + 0x3c);
  auVar19 = vpinsrw_avx(ZEXT216(uVar3),(uint)*(ushort *)(block + 0x1c),2);
  uVar27 = auVar23._0_4_;
  auVar28._4_4_ = uVar27;
  auVar28._0_4_ = uVar27;
  auVar28._8_4_ = uVar27;
  auVar28._12_4_ = uVar27;
  auVar10 = vpermt2b_avx512vl(auVar23,auVar21,auVar13);
  auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(block + 0x38),4);
  auVar13 = vpinsrb_avx(ZEXT116(block[0xe]),(uint)block[0x1e],1);
  auVar19 = vpinsrw_avx(auVar19,(uint)*(ushort *)(block + 8),6);
  auVar13 = vpinsrb_avx(auVar13,(uint)block[0x3a],2);
  auVar13 = vpinsrb_avx(auVar13,(uint)block[10],3);
  auVar13 = vpshufb_avx(auVar13,auVar25);
  auVar19 = vpor_avx(auVar13,auVar19);
  auVar13 = vpinsrb_avx(ZEXT116(block[0xf]),(uint)block[0x1f],1);
  auVar13 = vpinsrb_avx(auVar13,(uint)block[0x3b],2);
  auVar13 = vpinsrb_avx(auVar13,(uint)block[0xb],3);
  auVar11 = vpermt2b_avx512vl(auVar19,auVar21,auVar13);
  auVar13 = vpinsrd_avx(ZEXT316(CONCAT12(uVar1,uVar2)),(uint)uVar6,1);
  auVar13 = vpinsrd_avx(auVar13,uVar9,2);
  auVar13 = vpinsrd_avx(auVar13,(uint)uVar7,3);
  auVar23 = vpshufd_avx(auVar11,0xee);
  auVar12 = vpermi2d_avx512vl(auVar26,auVar11,auVar10);
  auVar26 = vpor_avx(auVar13,auVar22);
  auVar13 = vpermi2d_avx512vl(auVar18,auVar26,auVar23);
  auVar13 = vpblendd_avx2(auVar13,auVar28,4);
  auVar13 = vpaddd_avx(auVar13,*(undefined1 (*) [16])cv);
  auVar19 = vpinsrb_avx(ZEXT416(CONCAT31(in_register_00000011,block_len)),
                        CONCAT31(in_register_00000081,flags),4);
  auVar13 = vpaddd_avx(auVar13,*(undefined1 (*) [16])(cv + 4));
  auVar19 = vpunpcklqdq_avx(ZEXT416(uVar8),auVar19);
  auVar5 = vshufps_avx(auVar11,auVar10,0xf6);
  auVar22 = vpshufd_avx(auVar13,0x93);
  auVar14 = vprold_avx512vl(auVar13 ^ auVar19,0x10);
  auVar13 = vpaddd_avx(auVar14,_DAT_001a8290);
  auVar18 = vpblendd_avx2(auVar10,auVar26,0xc);
  auVar19 = vpmovsxbd_avx(ZEXT416(0x70301));
  auVar15 = vpermi2d_avx512vl(auVar19,auVar18,auVar11);
  auVar19 = vpmovsxbd_avx(ZEXT416(0x3050100));
  auVar16 = vpermi2d_avx512vl(auVar19,auVar12,auVar26);
  auVar19 = vpinsrw_avx(ZEXT216(uVar4),(uint)*(ushort *)(block + 0x20),2);
  auVar18 = vpinsrw_avx(auVar19,(uint)*(ushort *)(block + 0x2c),4);
  auVar19 = vpinsrb_avx(ZEXT116(block[6]),(uint)block[0x22],1);
  auVar18 = vpinsrw_avx(auVar18,(uint)*(ushort *)(block + 0x14),6);
  auVar19 = vpinsrb_avx(auVar19,(uint)block[0x2e],2);
  auVar19 = vpinsrb_avx(auVar19,(uint)block[0x16],3);
  auVar19 = vpshufb_avx(auVar19,auVar25);
  auVar18 = vpor_avx(auVar18,auVar19);
  auVar19 = vpinsrb_avx(ZEXT116(block[7]),(uint)block[0x23],1);
  auVar19 = vpinsrb_avx(auVar19,(uint)block[0x2f],2);
  auVar19 = vpinsrb_avx(auVar19,(uint)block[0x17],3);
  auVar17 = vpermt2b_avx512vl(auVar18,auVar21,auVar19);
  auVar19 = vpmovsxbd_avx(ZEXT416(0x7010400));
  auVar18 = vpshufd_avx(auVar13 ^ *(undefined1 (*) [16])(cv + 4),0x93);
  auVar18 = vprold_avx512vl(auVar18,0x14);
  auVar25 = vpshufd_avx(auVar11,0xe1);
  auVar24 = vpblendd_avx2(auVar17,auVar23,1);
  auVar12 = vshufps_avx(auVar26,auVar17,0x61);
  auVar28 = vpblendd_avx2(auVar17,auVar28,2);
  auVar19 = vpermi2d_avx512vl(auVar19,auVar25,auVar17);
  auVar19 = vpaddd_avx(auVar22,auVar19);
  auVar19 = vpaddd_avx(auVar19,auVar18);
  auVar23 = vpshufd_avx(auVar18,0x39);
  auVar18 = vpshufd_avx(auVar19,0x39);
  auVar22 = vpunpckhqdq_avx(auVar11,auVar10);
  auVar14 = vprold_avx512vl(auVar18 ^ auVar14,0x18);
  auVar18 = vpblendd_avx2(auVar22,auVar17,2);
  auVar19 = vpaddd_avx(auVar19,auVar18);
  auVar21 = vshufps_avx(auVar26,auVar17,0xe2);
  auVar18 = vpaddd_avx(auVar14,auVar13);
  auVar22 = vpshufd_avx(auVar14,0x4e);
  auVar13 = vinsertps_avx(auVar21,auVar10,0x70);
  auVar21 = vpshufd_avx(auVar18,0x39);
  auVar14 = vprold_avx512vl(auVar18 ^ auVar23,0x19);
  auVar19 = vpaddd_avx(auVar19,auVar14);
  auVar13 = vpaddd_avx(auVar19,auVar13);
  auVar18 = vpmovsxbd_avx(ZEXT416(0x1000304));
  auVar20 = vprold_avx512vl(auVar19 ^ auVar22,0x10);
  auVar19 = vpaddd_avx(auVar20,auVar21);
  auVar23 = vpshufd_avx(auVar19,0x93);
  auVar19 = vprold_avx512vl(auVar19 ^ auVar14,0x14);
  auVar13 = vpaddd_avx(auVar13,auVar19);
  auVar22 = vpshufd_avx(auVar19,0x93);
  auVar18 = vpermi2d_avx512vl(auVar18,auVar11,auVar10);
  auVar19 = vpshufd_avx(auVar13 ^ auVar20,0x93);
  auVar21 = vprold_avx512vl(auVar19,0x18);
  auVar13 = vpaddd_avx(auVar13,auVar18);
  auVar18 = vpmovsxbd_avx(ZEXT416(0x6010503));
  auVar19 = vpaddd_avx(auVar21,auVar23);
  auVar23 = vpshufd_avx(auVar21,0x4e);
  auVar21 = vpshufd_avx(auVar19,0x93);
  auVar22 = vprold_avx512vl(auVar19 ^ auVar22,0x19);
  auVar13 = vpaddd_avx(auVar13,auVar22);
  auVar19 = vpshufd_avx(auVar13,0x93);
  auVar14 = vprold_avx512vl(auVar13 ^ auVar23,0x10);
  auVar23 = vpermi2d_avx512vl(auVar18,auVar26,auVar10);
  auVar13 = vpaddd_avx(auVar14,auVar21);
  auVar18 = vpshufd_avx(auVar13 ^ auVar22,0x93);
  auVar19 = vpaddd_avx(auVar19,auVar23);
  auVar18 = vprold_avx512vl(auVar18,0x14);
  auVar19 = vpaddd_avx(auVar19,auVar18);
  auVar23 = vpshufd_avx(auVar18,0x39);
  auVar18 = vpshufd_avx(auVar19,0x39);
  auVar29._0_16_ = ZEXT116(0) * auVar17 + ZEXT116(1) * auVar26;
  auVar29._16_16_ = ZEXT116(1) * auVar17;
  auVar22 = vprold_avx512vl(auVar18 ^ auVar14,0x18);
  auVar18 = vpmovqd_avx512vl(auVar29);
  auVar13 = vpaddd_avx(auVar22,auVar13);
  auVar18 = vpblendd_avx2(auVar18,auVar10,8);
  auVar22 = vpshufd_avx(auVar22,0x4e);
  auVar19 = vpaddd_avx(auVar19,auVar18);
  auVar21 = vpshufd_avx(auVar13,0x39);
  auVar18 = vpmovsxbd_avx(ZEXT416(0x60703));
  auVar23 = vprold_avx512vl(auVar13 ^ auVar23,0x19);
  auVar13 = vpaddd_avx(auVar19,auVar23);
  auVar19 = vpaddd_avx(auVar13,auVar24);
  auVar22 = vprold_avx512vl(auVar13 ^ auVar22,0x10);
  auVar13 = vpaddd_avx(auVar22,auVar21);
  auVar24 = vpermi2d_avx512vl(auVar18,auVar17,auVar26);
  auVar21 = vprold_avx512vl(auVar13 ^ auVar23,0x14);
  auVar19 = vpaddd_avx(auVar19,auVar21);
  auVar18 = vprold_avx512vl(auVar19 ^ auVar22,0x18);
  auVar13 = vpaddd_avx(auVar18,auVar13);
  auVar23 = vpshufd_avx(auVar18,0x39);
  auVar18 = vpmovsxbd_avx(ZEXT416(0x2040501));
  auVar22 = vpshufd_avx(auVar13,0x4e);
  auVar13 = vpshufd_avx(auVar13 ^ auVar21,0x93);
  auVar21 = vprold_avx512vl(auVar13,0x19);
  auVar13 = vpermi2d_avx512vl(auVar18,auVar10,auVar11);
  auVar13 = vpaddd_avx(auVar19,auVar13);
  auVar18 = vshufps_avx(auVar10,auVar11,0xbc);
  auVar13 = vpaddd_avx(auVar13,auVar21);
  auVar19 = vpshufd_avx(auVar13,0x4e);
  auVar23 = vprold_avx512vl(auVar13 ^ auVar23,0x10);
  auVar13 = vpaddd_avx(auVar19,auVar18);
  auVar19 = vpaddd_avx(auVar23,auVar22);
  auVar23 = vpshufd_avx(auVar23,0x4e);
  auVar22 = vpshufd_avx(auVar19,0x93);
  auVar19 = vpshufd_avx(auVar19 ^ auVar21,0x4e);
  auVar19 = vprold_avx512vl(auVar19,0x14);
  auVar13 = vpaddd_avx(auVar13,auVar19);
  auVar21 = vpshufd_avx(auVar19,0x39);
  auVar19 = vpaddd_avx(auVar13,auVar12);
  auVar18 = vpmovsxbd_avx(ZEXT416(0x1060302));
  auVar23 = vprold_avx512vl(auVar13 ^ auVar23,0x18);
  auVar13 = vpshufd_avx(auVar23,0x39);
  auVar23 = vpshufd_avx(auVar23,0x93);
  auVar13 = vpaddd_avx(auVar13,auVar22);
  auVar22 = vpshufd_avx(auVar13,0x39);
  auVar21 = vprold_avx512vl(auVar13 ^ auVar21,0x19);
  auVar13 = vpaddd_avx(auVar19,auVar21);
  auVar12 = vpermi2d_avx512vl(auVar18,auVar10,auVar11);
  auVar19 = vpaddd_avx(auVar13,auVar24);
  auVar18 = vpmovsxbd_avx(ZEXT416(0x5000402));
  auVar24 = vprold_avx512vl(auVar13 ^ auVar23,0x10);
  auVar13 = vpaddd_avx(auVar24,auVar22);
  auVar23 = vpshufd_avx(auVar13,0x93);
  auVar22 = vprold_avx512vl(auVar13 ^ auVar21,0x14);
  auVar13 = vpaddd_avx(auVar19,auVar22);
  auVar22 = vpshufd_avx(auVar22,0x93);
  auVar19 = vpaddd_avx(auVar13,auVar12);
  auVar25 = vpermi2d_avx512vl(auVar18,auVar26,auVar25);
  auVar13 = vpshufd_avx(auVar13 ^ auVar24,0x93);
  auVar18 = vprold_avx512vl(auVar13,0x18);
  auVar13 = vpaddd_avx(auVar18,auVar23);
  auVar18 = vpshufd_avx(auVar18,0x4e);
  auVar23 = vpshufd_avx(auVar13,0x93);
  auVar22 = vprold_avx512vl(auVar13 ^ auVar22,0x19);
  auVar13 = vpaddd_avx(auVar19,auVar22);
  auVar19 = vpshufd_avx(auVar13,0x93);
  auVar21 = vprold_avx512vl(auVar13 ^ auVar18,0x10);
  auVar13 = vpaddd_avx(auVar19,auVar25);
  auVar19 = vpaddd_avx(auVar21,auVar23);
  auVar18 = vpshufd_avx(auVar19 ^ auVar22,0x93);
  auVar23 = vprold_avx512vl(auVar18,0x14);
  auVar13 = vpaddd_avx(auVar13,auVar23);
  auVar18 = vpshufd_avx(auVar13,0x39);
  auVar13 = vpaddd_avx(auVar13,auVar28);
  auVar22 = vprold_avx512vl(auVar18 ^ auVar21,0x18);
  auVar19 = vpaddd_avx(auVar22,auVar19);
  auVar18 = vpshufd_avx(auVar23,0x39);
  auVar23 = vpshufd_avx(auVar22,0x4e);
  auVar22 = vpshufd_avx(auVar19,0x39);
  auVar25 = vprold_avx512vl(auVar19 ^ auVar18,0x19);
  auVar19 = vpaddd_avx(auVar25,auVar13);
  auVar21 = vprold_avx512vl(auVar23 ^ auVar19,0x10);
  auVar18 = vpaddd_avx(auVar21,auVar22);
  auVar13 = vshufps_avx(auVar26,auVar11,0xfd);
  auVar23 = vpshufd_avx(auVar18,0x93);
  auVar13 = vinsertps_avx(auVar13,auVar17,0x70);
  auVar22 = vprold_avx512vl(auVar18 ^ auVar25,0x14);
  auVar13 = vpaddd_avx(auVar13,auVar19);
  auVar18 = vshufps_avx(auVar11,auVar26,0x86);
  auVar19 = vpaddd_avx(auVar22,auVar13);
  auVar22 = vpshufd_avx(auVar22,0x93);
  auVar13 = vinsertps_avx(auVar18,auVar10,0xd0);
  auVar13 = vpaddd_avx(auVar13,auVar19);
  auVar18 = vpmovsxbd_avx(ZEXT416(0x6010502));
  auVar19 = vpshufd_avx(auVar21 ^ auVar19,0x93);
  auVar25 = vprold_avx512vl(auVar19,0x18);
  auVar19 = vpaddd_avx(auVar25,auVar23);
  auVar23 = vpshufd_avx(auVar25,0x4e);
  auVar25 = vpshufd_avx(auVar19,0x93);
  auVar22 = vprold_avx512vl(auVar19 ^ auVar22,0x19);
  auVar13 = vpaddd_avx(auVar22,auVar13);
  auVar18 = vpermi2d_avx512vl(auVar18,auVar10,auVar17);
  auVar19 = vpshufd_avx(auVar13,0x93);
  auVar21 = vprold_avx512vl(auVar23 ^ auVar13,0x10);
  auVar13 = vpaddd_avx(auVar18,auVar19);
  auVar19 = vpaddd_avx(auVar21,auVar25);
  auVar18 = vpshufd_avx(auVar19 ^ auVar22,0x93);
  auVar23 = vprold_avx512vl(auVar18,0x14);
  auVar18 = vpaddd_avx(auVar23,auVar13);
  auVar23 = vpshufd_avx(auVar23,0x39);
  auVar13 = vpshufd_avx(auVar18,0x39);
  auVar22 = vshufps_avx(auVar26,auVar11,0xd7);
  auVar25 = vprold_avx512vl(auVar13 ^ auVar21,0x18);
  auVar13 = vblendps_avx(auVar22,auVar17,8);
  auVar18 = vpaddd_avx(auVar13,auVar18);
  auVar13 = vshufps_avx(auVar17,auVar11,0x34);
  auVar19 = vpaddd_avx(auVar25,auVar19);
  auVar22 = vpshufd_avx(auVar25,0x4e);
  auVar13 = vinsertps_avx(auVar13,auVar10,0x10);
  auVar25 = vpshufd_avx(auVar19,0x39);
  auVar23 = vprold_avx512vl(auVar19 ^ auVar23,0x19);
  auVar19 = vpaddd_avx(auVar23,auVar18);
  auVar13 = vpaddd_avx(auVar13,auVar19);
  auVar18 = vpmovsxbd_avx(ZEXT416(0x2040601));
  auVar22 = vprold_avx512vl(auVar22 ^ auVar19,0x10);
  auVar19 = vpaddd_avx(auVar22,auVar25);
  auVar25 = vprold_avx512vl(auVar19 ^ auVar23,0x14);
  auVar13 = vpaddd_avx(auVar25,auVar13);
  auVar18 = vpermi2d_avx512vl(auVar18,auVar17,auVar26);
  auVar23 = vprold_avx512vl(auVar22 ^ auVar13,0x18);
  auVar19 = vpaddd_avx(auVar23,auVar19);
  auVar13 = vpaddd_avx(auVar18,auVar13);
  auVar18 = vpshufd_avx(auVar23,0x39);
  auVar23 = vpshufd_avx(auVar19,0x4e);
  auVar19 = vpshufd_avx(auVar19 ^ auVar25,0x93);
  auVar22 = vprold_avx512vl(auVar19,0x19);
  auVar13 = vpaddd_avx(auVar22,auVar13);
  auVar19 = vpshufd_avx(auVar13,0x4e);
  auVar25 = vprold_avx512vl(auVar18 ^ auVar13,0x10);
  auVar21 = vpermi2ps_avx512vl(_DAT_001a8360,auVar5,auVar17);
  auVar13 = vpaddd_avx(auVar25,auVar23);
  auVar18 = vpshufd_avx(auVar13,0x93);
  auVar23 = vpshufd_avx(auVar13 ^ auVar22,0x4e);
  auVar13 = vpaddd_avx(auVar21,auVar19);
  auVar22 = vpshufd_avx(auVar25,0x4e);
  auVar25 = vprold_avx512vl(auVar23,0x14);
  auVar13 = vpaddd_avx(auVar25,auVar13);
  auVar19 = vpaddd_avx(auVar13,auVar15);
  auVar23 = vprold_avx512vl(auVar13 ^ auVar22,0x18);
  auVar13 = vpshufd_avx(auVar23,0x39);
  auVar23 = vpshufd_avx(auVar23,0x93);
  auVar13 = vpaddd_avx(auVar13,auVar18);
  auVar18 = vpshufd_avx(auVar25,0x39);
  auVar22 = vpshufd_avx(auVar13,0x39);
  auVar18 = vprold_avx512vl(auVar13 ^ auVar18,0x19);
  auVar13 = vpaddd_avx(auVar18,auVar19);
  auVar19 = vpaddd_avx(auVar13,auVar16);
  auVar23 = vprold_avx512vl(auVar13 ^ auVar23,0x10);
  auVar13 = vpaddd_avx(auVar23,auVar22);
  auVar22 = vprold_avx512vl(auVar18 ^ auVar13,0x14);
  auVar19 = vpaddd_avx(auVar22,auVar19);
  auVar18 = vpshufd_avx(auVar19,0x4e);
  auVar23 = vprold_avx512vl(auVar19 ^ auVar23,0x18);
  auVar19 = vpaddd_avx(auVar18,auVar17);
  auVar13 = vpaddd_avx(auVar23,auVar13);
  auVar18 = vpshufd_avx(auVar13,0x39);
  auVar13 = vpshufd_avx(auVar22 ^ auVar13,0x39);
  auVar22 = vprold_avx512vl(auVar13,0x19);
  auVar13 = vpaddd_avx(auVar19,auVar22);
  auVar19 = vpshufd_avx(auVar13,0x39);
  auVar13 = vpaddd_avx(auVar13,auVar26);
  auVar23 = vprold_avx512vl(auVar19 ^ auVar23,0x10);
  auVar19 = vpaddd_avx(auVar23,auVar18);
  auVar18 = vpshufd_avx(auVar19,0x93);
  auVar18 = vprold_avx512vl(auVar18 ^ auVar22,0x14);
  auVar13 = vpaddd_avx(auVar13,auVar18);
  auVar18 = vpshufd_avx(auVar18,0x39);
  auVar26 = vpshufd_avx(auVar13,0x39);
  auVar13 = vpaddd_avx(auVar13,auVar11);
  auVar26 = vprold_avx512vl(auVar26 ^ auVar23,0x18);
  auVar19 = vpaddd_avx(auVar26,auVar19);
  auVar26 = vpshufd_avx(auVar26,0x4e);
  auVar23 = vpshufd_avx(auVar19,0x39);
  auVar18 = vprold_avx512vl(auVar19 ^ auVar18,0x19);
  auVar13 = vpaddd_avx(auVar13,auVar18);
  auVar19 = vpaddd_avx(auVar13,auVar10);
  auVar26 = vprold_avx512vl(auVar13 ^ auVar26,0x10);
  auVar13 = vpaddd_avx(auVar26,auVar23);
  auVar23 = vprold_avx512vl(auVar13 ^ auVar18,0x14);
  auVar19 = vpaddd_avx(auVar19,auVar23);
  auVar18 = vpshufd_avx(auVar19,0x4e);
  auVar19 = vprold_avx512vl(auVar19 ^ auVar26,0x18);
  auVar13 = vpaddd_avx(auVar19,auVar13);
  auVar19 = vpshufd_avx(auVar19,0x93);
  *(undefined1 (*) [16])cv = auVar13 ^ auVar18;
  auVar13 = vpshufd_avx(auVar13 ^ auVar23,0x39);
  auVar13 = vprold_avx512vl(auVar13,0x19);
  *(undefined1 (*) [16])(cv + 4) = auVar13 ^ auVar19;
  return;
}

Assistant:

void blake3_compress_in_place_portable(uint32_t cv[8],
                                       const uint8_t block[BLAKE3_BLOCK_LEN],
                                       uint8_t block_len, uint64_t counter,
                                       uint8_t flags) {
  uint32_t state[16];
  compress_pre(state, cv, block, block_len, counter, flags);
  cv[0] = state[0] ^ state[8];
  cv[1] = state[1] ^ state[9];
  cv[2] = state[2] ^ state[10];
  cv[3] = state[3] ^ state[11];
  cv[4] = state[4] ^ state[12];
  cv[5] = state[5] ^ state[13];
  cv[6] = state[6] ^ state[14];
  cv[7] = state[7] ^ state[15];
}